

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O1

stop_bits stop_bits_from_text(string *s)

{
  int iVar1;
  type tVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)s);
  if (iVar1 == 0) {
    tVar2 = one;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)s);
    if (iVar1 == 0) {
      tVar2 = onepointfive;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)s);
      tVar2 = two;
      if (iVar1 != 0) {
        __assert_fail("s == \"2\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface.cpp"
                      ,0x8e,
                      "boost::asio::serial_port_base::stop_bits stop_bits_from_text(const std::string &)"
                     );
      }
    }
  }
  return (stop_bits)tVar2;
}

Assistant:

static boost::asio::serial_port_base::stop_bits stop_bits_from_text( const std::string& s )
{
    if ( s == "1" )
    {
        return boost::asio::serial_port_base::stop_bits(
            boost::asio::serial_port_base::stop_bits::one );
    }
    else if ( s == "1.5" )
    {
        return boost::asio::serial_port_base::stop_bits(
            boost::asio::serial_port_base::stop_bits::onepointfive );
    }

    assert( s == "2" );

    return boost::asio::serial_port_base::stop_bits(
        boost::asio::serial_port_base::stop_bits::two );
}